

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O3

void __thiscall
cmLinkDirectoriesCommand::AddLinkDir
          (cmLinkDirectoriesCommand *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *directories)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  string tmp;
  string unixPath;
  ostringstream e;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  pcVar1 = (dir->_M_dataplus)._M_p;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + dir->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_1c0);
  bVar3 = cmsys::SystemTools::FileIsFullPath(&local_1c0);
  if ((bVar3) ||
     (((1 < local_1c0._M_string_length && (*local_1c0._M_dataplus._M_p == '$')) &&
      (local_1c0._M_dataplus._M_p[1] == '<')))) goto LAB_0022c7b3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"This command specifies the relative path\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"as a link directory.\n",0x15);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1e0,(cmPolicies *)0xf,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
LAB_0022c724:
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    pcVar1 = (psVar6->_M_dataplus)._M_p;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,pcVar1 + psVar6->_M_string_length);
    std::__cxx11::string::append((char *)&local_1e0);
    std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1c0._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
LAB_0022c788:
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar4 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0xf,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_0022c788;
  }
  else if (PVar4 == NEW) goto LAB_0022c724;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_0022c7b3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(directories,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(
  std::string const& dir, std::vector<std::string>& directories)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if (!cmSystemTools::FileIsFullPath(unixPath) &&
      !cmGeneratorExpression::StartsWithGeneratorExpression(unixPath)) {
    bool convertToAbsolute = false;
    std::ostringstream e;
    /* clang-format off */
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    /* clang-format on */
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
    }
    if (convertToAbsolute) {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
    }
  }
  directories.push_back(unixPath);
}